

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_> *
libtorrent::anon_unknown_91::default_plugins
          (vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           *__return_storage_ptr__,bool empty)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined7 in_register_00000031;
  long lVar1;
  initializer_list<std::shared_ptr<libtorrent::plugin>_> __l;
  undefined8 uStack_68;
  shared_ptr<libtorrent::plugin> local_60;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  if ((int)CONCAT71(in_register_00000031,empty) == 0) {
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    (local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 1;
    (local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_weak_count = 1;
    (local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004658b8;
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
    ._vptr__Sp_counted_base = (_func_int **)&PTR__session_plugin_wrapper_00465938;
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
    ._M_use_count = 0;
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
    ._M_weak_count = 0;
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
    ._vptr__Sp_counted_base = (_func_int **)0x0;
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]
    ._vptr__Sp_counted_base =
         (_func_int **)
         std::
         _Function_handler<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*),_std::shared_ptr<libtorrent::torrent_plugin>_(*)(const_libtorrent::torrent_handle_&,_void_*)>
         ::_M_invoke;
    *(code **)&local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi[1]._M_use_count = create_ut_pex_plugin;
    local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
    ._vptr__Sp_counted_base = (_func_int **)0x0;
    *(code **)&local_60.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi[2]._M_use_count =
         std::
         _Function_handler<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*),_std::shared_ptr<libtorrent::torrent_plugin>_(*)(const_libtorrent::torrent_handle_&,_void_*)>
         ::_M_manager;
    local_48 = (undefined8 *)operator_new(0x38);
    local_48[1] = 0x100000001;
    *local_48 = &PTR___Sp_counted_ptr_inplace_004658b8;
    local_50 = local_48 + 2;
    local_48[2] = &PTR__session_plugin_wrapper_00465938;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[6] = std::
                  _Function_handler<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*),_std::shared_ptr<libtorrent::torrent_plugin>_(*)(const_libtorrent::torrent_handle_&,_void_*)>
                  ::_M_invoke;
    local_48[3] = create_ut_metadata_plugin;
    local_48[4] = 0;
    local_48[5] = std::
                  _Function_handler<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*),_std::shared_ptr<libtorrent::torrent_plugin>_(*)(const_libtorrent::torrent_handle_&,_void_*)>
                  ::_M_manager;
    local_38 = (undefined8 *)operator_new(0x38);
    local_38[1] = 0x100000001;
    *local_38 = &PTR___Sp_counted_ptr_inplace_004658b8;
    local_40 = local_38 + 2;
    local_38[2] = &PTR__session_plugin_wrapper_00465938;
    local_38[3] = 0;
    local_38[4] = 0;
    local_38[6] = std::
                  _Function_handler<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*),_std::shared_ptr<libtorrent::torrent_plugin>_(*)(const_libtorrent::torrent_handle_&,_void_*)>
                  ::_M_invoke;
    local_38[3] = create_smart_ban_plugin;
    local_38[4] = 0;
    local_38[5] = std::
                  _Function_handler<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*),_std::shared_ptr<libtorrent::torrent_plugin>_(*)(const_libtorrent::torrent_handle_&,_void_*)>
                  ::_M_manager;
    __l._M_len = 3;
    __l._M_array = &local_60;
    std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::vector(__return_storage_ptr__,__l,(allocator_type *)((long)&uStack_68 + 7));
    lVar1 = 0x30;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar1) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar1));
      }
      lVar1 = lVar1 + -0x10;
    } while (lVar1 != 0);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<plugin>> default_plugins(
			bool empty = false)
		{
#ifndef TORRENT_DISABLE_EXTENSIONS
			if (empty) return {};
			using wrapper = aux::session_impl::session_plugin_wrapper;
			return {
				std::make_shared<wrapper>(create_ut_pex_plugin),
				std::make_shared<wrapper>(create_ut_metadata_plugin),
				std::make_shared<wrapper>(create_smart_ban_plugin)
			};
#else
			TORRENT_UNUSED(empty);
			return {};
#endif
		}